

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O2

void __thiscall
ThreadParser::SAXHandler::startElement(SAXHandler *this,XMLCh *name,AttributeList *attributes)

{
  long lVar1;
  XMLCh *pXVar2;
  long lVar3;
  
  addToCheckSum(this->SAXInstance,name,0xffffffffffffffff);
  lVar1 = (**(code **)(*(long *)attributes + 0x10))(attributes);
  for (lVar3 = 0; lVar1 != lVar3; lVar3 = lVar3 + 1) {
    pXVar2 = (XMLCh *)(**(code **)(*(long *)attributes + 0x18))(attributes,lVar3);
    addToCheckSum(this->SAXInstance,pXVar2,0xffffffffffffffff);
    pXVar2 = (XMLCh *)(**(code **)(*(long *)attributes + 0x28))(attributes,lVar3);
    addToCheckSum(this->SAXInstance,pXVar2,0xffffffffffffffff);
  }
  return;
}

Assistant:

void ThreadParser::SAXHandler::startElement(const XMLCh *const name, AttributeList &attributes)
{
    SAXInstance->addToCheckSum(name);
    XMLSize_t n = attributes.getLength();
    XMLSize_t i;
    for (i=0; i<n; i++)
    {
        const XMLCh *attNam = attributes.getName(i);
        SAXInstance->addToCheckSum(attNam);
        const XMLCh *attVal = attributes.getValue(i);
        SAXInstance->addToCheckSum(attVal);
    }
}